

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O2

void __thiscall
gepard::SegmentApproximator::splitCubeCurve(SegmentApproximator *this,FloatPoint *points)

{
  FloatPoint FVar1;
  FloatPoint cd;
  FloatPoint d;
  FloatPoint bccd;
  FloatPoint abbc;
  FloatPoint ab;
  FloatPoint a;
  FloatPoint bc;
  FloatPoint c;
  FloatPoint b;
  Float local_e0;
  FloatPoint local_d8;
  FloatPoint local_c8;
  FloatPoint local_b8;
  FloatPoint local_a8;
  FloatPoint local_98;
  FloatPoint local_88;
  FloatPoint local_78;
  FloatPoint local_68;
  FloatPoint local_58;
  FloatPoint local_48;
  
  local_78.x = points->x;
  local_78.y = points->y;
  local_48.x = points[1].x;
  local_48.y = points[1].y;
  local_58.x = points[2].x;
  local_58.y = points[2].y;
  local_c8.x = points[3].x;
  local_c8.y = points[3].y;
  FVar1 = operator+(&local_78,&local_48);
  local_68.y = FVar1.y;
  local_68.x = FVar1.x;
  local_d8.x = 2.0;
  FVar1 = operator/(&local_68,&local_d8.x);
  local_88.y = FVar1.y;
  local_88.x = FVar1.x;
  FVar1 = operator+(&local_48,&local_58);
  local_d8.y = FVar1.y;
  local_d8.x = FVar1.x;
  local_98.x = 2.0;
  FVar1 = operator/(&local_d8,&local_98.x);
  local_68.y = FVar1.y;
  local_68.x = FVar1.x;
  FVar1 = operator+(&local_58,&local_c8);
  local_98.y = FVar1.y;
  local_98.x = FVar1.x;
  local_a8.x = 2.0;
  FVar1 = operator/(&local_98,&local_a8.x);
  local_d8.y = FVar1.y;
  local_d8.x = FVar1.x;
  FVar1 = operator+(&local_88,&local_68);
  local_a8.y = FVar1.y;
  local_a8.x = FVar1.x;
  local_b8.x = 2.0;
  FVar1 = operator/(&local_a8,&local_b8.x);
  local_98.y = FVar1.y;
  local_98.x = FVar1.x;
  FVar1 = operator+(&local_68,&local_d8);
  local_b8.y = FVar1.y;
  local_b8.x = FVar1.x;
  local_e0 = 2.0;
  FVar1 = operator/(&local_b8,&local_e0);
  local_a8.y = FVar1.y;
  local_a8.x = FVar1.x;
  FVar1 = operator+(&local_98,&local_a8);
  local_b8.y = FVar1.y;
  local_b8.x = FVar1.x;
  local_e0 = 2.0;
  FVar1 = operator/(&local_b8,&local_e0);
  points->x = local_78.x;
  points->y = local_78.y;
  points[1].x = local_88.x;
  points[1].y = local_88.y;
  points[2].x = local_98.x;
  points[2].y = local_98.y;
  points[3].x = FVar1.x;
  points[3].y = FVar1.y;
  points[4].x = local_a8.x;
  points[4].y = local_a8.y;
  points[5].x = local_d8.x;
  points[5].y = local_d8.y;
  points[6].x = local_c8.x;
  points[6].y = local_c8.y;
  return;
}

Assistant:

void SegmentApproximator::splitCubeCurve(FloatPoint points[])
{
    const FloatPoint a = points[0];
    const FloatPoint b = points[1];
    const FloatPoint c = points[2];
    const FloatPoint d = points[3];
    const FloatPoint ab = (a + b) / 2.0;
    const FloatPoint bc = (b + c) / 2.0;
    const FloatPoint cd = (c + d) / 2.0;
    const FloatPoint abbc = (ab + bc) / 2.0;
    const FloatPoint bccd = (bc + cd) / 2.0;
    const FloatPoint mid = (abbc + bccd) / 2.0;

    points[0] = a;
    points[1] = ab;
    points[2] = abbc;
    points[3] = mid;
    points[4] = bccd;
    points[5] = cd;
    points[6] = d;
}